

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cc
# Opt level: O1

void __thiscall tt::net::HttpData::reset(HttpData *this)

{
  weak_ptr<tt::net::TimerNode> *this_00;
  int iVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  bool bVar5;
  
  (this->fileName_)._M_string_length = 0;
  *(this->fileName_)._M_dataplus._M_p = '\0';
  (this->path_)._M_string_length = 0;
  *(this->path_)._M_dataplus._M_p = '\0';
  this->nowReadPos_ = 0;
  this->state_ = STATE_PARSE_URI;
  this->hState_ = H_START;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->headers_)._M_t);
  p_Var3 = (this->timer_).super___weak_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = p_Var3->_M_use_count;
    do {
      if (iVar2 == 0) {
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = p_Var3->_M_use_count;
      bVar5 = iVar2 == iVar1;
      if (bVar5) {
        p_Var3->_M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar5);
  }
  this_00 = &this->timer_;
  if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar5 = true;
  }
  else {
    bVar5 = p_Var3->_M_use_count == 0;
  }
  peVar4 = (this_00->super___weak_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (!(bool)(peVar4 == (element_type *)0x0 | bVar5)) {
    p_Var3 = (this->timer_).super___weak_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar2 = p_Var3->_M_use_count;
      do {
        if (iVar2 == 0) {
          p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar1 = p_Var3->_M_use_count;
        bVar5 = iVar2 == iVar1;
        if (bVar5) {
          p_Var3->_M_use_count = iVar2 + 1;
          iVar1 = iVar2;
        }
        iVar2 = iVar1;
        UNLOCK();
      } while (!bVar5);
    }
    if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = p_Var3->_M_use_count == 0;
    }
    if (bVar5) {
      peVar4 = (TimerNode *)0x0;
    }
    else {
      peVar4 = (this_00->super___weak_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    TimerNode::clearReq(peVar4);
    std::__weak_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>::reset
              (&this_00->super___weak_ptr<tt::net::TimerNode,_(__gnu_cxx::_Lock_policy)2>);
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      return;
    }
  }
  return;
}

Assistant:

void HttpData::reset() {
  // inBuffer_.clear();
  fileName_.clear();
  path_.clear();
  nowReadPos_ = 0;
  state_ = STATE_PARSE_URI;
  hState_ = H_START;
  headers_.clear();
  // keepAlive_ = false;
  if (timer_.lock()) {
	  std::shared_ptr<TimerNode> my_timer(timer_.lock());
    my_timer->clearReq();
    timer_.reset();
  }
}